

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O1

void __thiscall QFunctionJAOHTree::Load(QFunctionJAOHTree *this)

{
  string *in_RSI;
  
  Load((QFunctionJAOHTree *)
       (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 +
       *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x38)),in_RSI);
  return;
}

Assistant:

void QFunctionJAOHTree::Load(const string &filename)
{
    if(_m_initialized)
        Initialize();
#if 0 // don't use this, it makes a copy (so you need twice the memory)

    _m_QValues=MDPSolver::LoadQTable(filename,
                                     GetPU()->
                                     GetNrJointActionObservationHistories(),
                                     GetPU()->GetNrJointActions());
#else
    QTable::Load(filename,
                 GetPU()->GetNrJointActionObservationHistories(),
                 GetPU()->GetNrJointActions(),
                 _m_QValues);
#endif
}